

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

uint64_t __thiscall mkvmuxer::Chapter::WriteAtom(Chapter *this,IMkvWriter *writer)

{
  bool bVar1;
  char *value;
  uint64 uVar2;
  uint64 uVar3;
  uint64_t uVar4;
  long lVar5;
  long lVar6;
  IMkvWriter *type;
  long *in_RSI;
  IMkvWriter *in_RDI;
  int64_t stop;
  Display *d_1;
  int idx_1;
  int64_t start;
  uint64_t atom_size;
  Display *d;
  int idx;
  uint64_t payload_size;
  char *in_stack_ffffffffffffff90;
  IMkvWriter *writer_00;
  IMkvWriter *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int iVar7;
  int local_24;
  char *local_20;
  char *local_8;
  
  value = (char *)EbmlElementSize((uint64)in_RDI,in_stack_ffffffffffffff90);
  uVar2 = EbmlElementSize((uint64)in_stack_ffffffffffffff90,(uint64)value);
  type = (IMkvWriter *)(value + uVar2);
  uVar2 = EbmlElementSize((uint64)type,(uint64)value);
  writer_00 = type;
  uVar3 = EbmlElementSize((uint64)type,(uint64)value);
  local_20 = (char *)((long)&type->_vptr_IMkvWriter + uVar3 + uVar2);
  for (local_24 = 0; local_24 < *(int *)((long)&in_RDI[5]._vptr_IMkvWriter + 4);
      local_24 = local_24 + 1) {
    uVar4 = Display::WriteDisplay
                      ((Display *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       in_stack_ffffffffffffffb0);
    local_20 = local_20 + uVar4;
  }
  uVar2 = EbmlMasterElementSize((uint64)writer_00,(uint64)value);
  local_8 = local_20 + uVar2;
  if (in_RSI != (long *)0x0) {
    lVar5 = (**(code **)(*in_RSI + 8))();
    bVar1 = WriteEbmlMasterElement(in_RDI,(uint64)writer_00,(uint64)value);
    if (bVar1) {
      bVar1 = WriteEbmlElement(in_RDI,(uint64)writer_00,value);
      if (bVar1) {
        bVar1 = WriteEbmlElement(writer_00,(uint64)value,0x175ea0);
        if (bVar1) {
          bVar1 = WriteEbmlElement(writer_00,(uint64)value,0x175eca);
          if (bVar1) {
            bVar1 = WriteEbmlElement(writer_00,(uint64)value,0x175ef4);
            if (bVar1) {
              for (iVar7 = 0; iVar7 < *(int *)((long)&in_RDI[5]._vptr_IMkvWriter + 4);
                  iVar7 = iVar7 + 1) {
                uVar4 = Display::WriteDisplay
                                  ((Display *)CONCAT44(iVar7,in_stack_ffffffffffffffb8),
                                   (IMkvWriter *)(in_RDI[4]._vptr_IMkvWriter + (long)iVar7 * 3));
                if (uVar4 == 0) {
                  return 0;
                }
              }
              lVar6 = (**(code **)(*in_RSI + 8))();
              if ((lVar5 <= lVar6) && ((char *)(lVar6 - lVar5) != local_8)) {
                local_8 = (char *)0x0;
              }
            }
            else {
              local_8 = (char *)0x0;
            }
          }
          else {
            local_8 = (char *)0x0;
          }
        }
        else {
          local_8 = (char *)0x0;
        }
      }
      else {
        local_8 = (char *)0x0;
      }
    }
    else {
      local_8 = (char *)0x0;
    }
  }
  return (uint64_t)local_8;
}

Assistant:

uint64_t Chapter::WriteAtom(IMkvWriter* writer) const {
  uint64_t payload_size =
      EbmlElementSize(libwebm::kMkvChapterStringUID, id_) +
      EbmlElementSize(libwebm::kMkvChapterUID, static_cast<uint64>(uid_)) +
      EbmlElementSize(libwebm::kMkvChapterTimeStart,
                      static_cast<uint64>(start_timecode_)) +
      EbmlElementSize(libwebm::kMkvChapterTimeEnd,
                      static_cast<uint64>(end_timecode_));

  for (int idx = 0; idx < displays_count_; ++idx) {
    const Display& d = displays_[idx];
    payload_size += d.WriteDisplay(NULL);
  }

  const uint64_t atom_size =
      EbmlMasterElementSize(libwebm::kMkvChapterAtom, payload_size) +
      payload_size;

  if (writer == NULL)
    return atom_size;

  const int64_t start = writer->Position();

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvChapterAtom, payload_size))
    return 0;

  if (!WriteEbmlElement(writer, libwebm::kMkvChapterStringUID, id_))
    return 0;

  if (!WriteEbmlElement(writer, libwebm::kMkvChapterUID,
                        static_cast<uint64>(uid_)))
    return 0;

  if (!WriteEbmlElement(writer, libwebm::kMkvChapterTimeStart,
                        static_cast<uint64>(start_timecode_)))
    return 0;

  if (!WriteEbmlElement(writer, libwebm::kMkvChapterTimeEnd,
                        static_cast<uint64>(end_timecode_)))
    return 0;

  for (int idx = 0; idx < displays_count_; ++idx) {
    const Display& d = displays_[idx];

    if (!d.WriteDisplay(writer))
      return 0;
  }

  const int64_t stop = writer->Position();

  if (stop >= start && uint64_t(stop - start) != atom_size)
    return 0;

  return atom_size;
}